

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerReflection::to_member_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerReflection *this,SPIRType *type,uint32_t index)

{
  Decoration *pDVar1;
  Meta *pMVar2;
  undefined4 in_register_0000000c;
  uint *ts_1;
  char local_14 [4];
  
  ts_1 = (uint *)CONCAT44(in_register_0000000c,index);
  pMVar2 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,
                               (ID)(type->super_IVariant).self.id);
  if ((pMVar2 != (Meta *)0x0) &&
     (ts_1 = (uint *)(ulong)index,
     ts_1 < (uint *)(pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size))
  {
    pDVar1 = (pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    if (pDVar1[(long)ts_1].alias._M_string_length != 0) {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)(pDVar1 + (long)ts_1));
      return __return_storage_ptr__;
    }
  }
  join<char_const(&)[3],unsigned_int&>
            (__return_storage_ptr__,(spirv_cross *)0x3b2f7e,(char (*) [3])local_14,ts_1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerReflection::to_member_name(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.self);

	if (type_meta)
	{
		auto &memb = type_meta->members;
		if (index < memb.size() && !memb[index].alias.empty())
			return memb[index].alias;
		else
			return join("_m", index);
	}
	else
		return join("_m", index);
}